

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O1

int Abc_GraphBuildState(Vec_Int_t *vState,int e,int x,Vec_Int_t *vEdges,Vec_Int_t *vLife,
                       Vec_Wec_t *vFronts,int *pFront,Vec_Int_t *vStateNew,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  uint local_5c [4];
  uint local_4c;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  if (-1 < e) {
    uVar13 = (ulong)(uint)e;
    if ((e < vFronts->nSize) && ((int)(e + 1U) < vFronts->nSize)) {
      if (vEdges->nSize <= e * 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      local_4c = e + 1U;
      local_38 = vEdges->pArray;
      local_40 = (ulong)(uint)(e * 2);
      if (local_38[local_40 + 1] <= local_38[local_40]) {
        __assert_fail("pNodes[0] < pNodes[1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                      ,0x17b,
                      "int Abc_GraphBuildState(Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, int *, Vec_Int_t *, int)"
                     );
      }
      pVVar4 = vFronts->pArray;
      local_5c[2] = vLife->nSize;
      if (fVerbose != 0) {
        printf("Edge = %d. Arc = %d.\nCurrent state: ",(ulong)(uint)e,(ulong)(uint)x);
      }
      local_48 = uVar13;
      local_5c[3] = x;
      if (0 < pVVar4[uVar13].nSize) {
        lVar14 = 0;
        do {
          if (vState->nSize <= lVar14) goto LAB_0048d2c7;
          uVar9 = vState->pArray[lVar14];
          pFront[pVVar4[uVar13].pArray[lVar14]] = uVar9;
          if (fVerbose != 0) {
            printf("%d(%d) ",(ulong)(uVar9 & 0xffff),(ulong)(uint)((int)uVar9 >> 0x10));
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < pVVar4[uVar13].nSize);
      }
      uVar7 = local_4c;
      uVar9 = local_5c[2];
      if (fVerbose != 0) {
        putchar(10);
      }
      uVar3 = local_5c[3];
      piVar6 = local_38 + local_40;
      lVar14 = 0;
      do {
        iVar1 = piVar6[lVar14];
        if ((long)iVar1 < 0) goto LAB_0048d2c7;
        uVar2 = iVar1 * 2;
        uVar8 = vLife->nSize;
        if (uVar8 == uVar2 || SBORROW4(uVar8,uVar2) != (int)(uVar8 + iVar1 * -2) < 0)
        goto LAB_0048d2c7;
        iVar11 = (int)local_48;
        if (vLife->pArray[uVar2] == iVar11) {
          pFront[iVar1] = iVar1;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      if (local_5c[3] != 0) {
        if ((short)pFront[piVar6[1]] == (short)pFront[*piVar6]) {
          return -1;
        }
        lVar14 = 0;
        do {
          iVar1 = piVar6[lVar14];
          iVar12 = pFront[iVar1] >> 0x10;
          if (iVar1 == (int)uVar9 / 2 + -1 || iVar1 == 0) {
            if (0 < iVar12) {
              return -1;
            }
          }
          else if (1 < iVar12) {
            return -1;
          }
          pFront[iVar1] = pFront[iVar1] + 0x10000;
          lVar14 = lVar14 + 1;
        } while (lVar14 == 1);
      }
      local_5c[0] = (uint)*(ushort *)(pFront + *piVar6);
      local_5c[1] = (uint)*(ushort *)(pFront + piVar6[1]);
      lVar14 = 0;
      while( true ) {
        iVar1 = piVar6[lVar14];
        if (((long)iVar1 < 0) || (uVar8 = iVar1 * 2 + 1, vLife->nSize <= (int)uVar8)) break;
        if (vLife->pArray[uVar8] == iVar11) {
          iVar12 = pFront[iVar1] >> 0x10;
          if (iVar1 == (int)uVar9 / 2 + -1 || iVar1 == 0) {
            if (iVar12 != 1) {
              return -1;
            }
          }
          else if (0xffff < (uint)pFront[iVar1] && iVar12 != 2) {
            return -1;
          }
          if (pVVar4[uVar7].nSize < 1) {
            uVar8 = 0xffffffff;
          }
          else {
            piVar5 = pVVar4[uVar7].pArray;
            uVar8 = 0xffffffff;
            lVar10 = 0;
            do {
              uVar2 = piVar5[lVar10];
              if (uVar2 == piVar6[lVar14]) {
                __assert_fail("Node != pNodes[n]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                              ,0x1a0,
                              "int Abc_GraphBuildState(Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, int *, Vec_Int_t *, int)"
                             );
              }
              if ((pFront[(int)uVar2] & 0xffffU) == local_5c[lVar14]) {
                if (uVar8 == 0xffffffff) {
                  uVar8 = uVar2;
                }
                pFront[(int)uVar2] = pFront[(int)uVar2] & 0xffff0000U | uVar8;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < pVVar4[uVar7].nSize);
          }
          if (uVar8 != 0xffffffff) {
            local_5c[lVar14] = uVar8;
          }
        }
        bVar15 = lVar14 != 0;
        lVar14 = lVar14 + 1;
        if (bVar15) {
          if ((uVar3 != 0) && (0 < pVVar4[uVar7].nSize)) {
            piVar6 = pVVar4[uVar7].pArray;
            uVar9 = 0xffffffff;
            lVar14 = 0;
            do {
              uVar3 = piVar6[lVar14];
              uVar8 = pFront[(int)uVar3] & 0xffff;
              if ((uVar8 == local_5c[0]) || (uVar8 == local_5c[1])) {
                if (uVar9 == 0xffffffff) {
                  uVar9 = uVar3;
                }
                pFront[(int)uVar3] = pFront[(int)uVar3] & 0xffff0000U | uVar9;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < pVVar4[uVar7].nSize);
          }
          vStateNew->nSize = 0;
          if (fVerbose != 0) {
            printf("Next state: ");
          }
          if (0 < pVVar4[uVar7].nSize) {
            lVar14 = 0;
            do {
              iVar1 = pVVar4[uVar7].pArray[lVar14];
              Vec_IntPush(vStateNew,pFront[iVar1]);
              if (fVerbose != 0) {
                printf("%d(%d) ",(ulong)(pFront[iVar1] & 0xffff),
                       (ulong)(uint)(pFront[iVar1] >> 0x10));
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < pVVar4[uVar7].nSize);
          }
          if (fVerbose != 0) {
            puts("\n");
          }
          return 1;
        }
      }
LAB_0048d2c7:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Abc_GraphBuildState( Vec_Int_t * vState, int e, int x, Vec_Int_t * vEdges, Vec_Int_t * vLife, Vec_Wec_t * vFronts, int * pFront, Vec_Int_t * vStateNew, int fVerbose )
{
    Vec_Int_t * vFront = Vec_WecEntry( vFronts, e );
    Vec_Int_t * vFront2 = Vec_WecEntry( vFronts, e+1 );
    int * pNodes = Vec_IntEntryP(vEdges, 2*e);
    int nNodes = Vec_IntSize(vLife)/2;
    int i, n, Node, First, pEquivs[2];
    assert( pNodes[0] < pNodes[1] );
    if ( fVerbose ) printf( "Edge = %d. Arc = %d.\nCurrent state: ", e, x );
    Vec_IntForEachEntry( vFront, Node, i )
    {
        pFront[Node] = Vec_IntEntry(vState, i);
        if ( fVerbose ) printf( "%d(%d) ", pFront[Node] & 0xFFFF, pFront[Node] >> 16 );
    }
    if ( fVerbose ) printf( "\n" );
    for ( n = 0; n < 2; n++ )
        if ( Vec_IntEntry(vLife, 2*pNodes[n]) == e ) // first time
            pFront[pNodes[n]] = pNodes[n]; // degree = 0; comp = singleton
    if ( x )
    {
        if ( (pFront[pNodes[0]] & 0xFFFF) == (pFront[pNodes[1]] & 0xFFFF) ) // the same comp
            return -1; // const 0
        for ( n = 0; n < 2; n++ )
        {
            int Degree = pFront[pNodes[n]] >> 16;
            if ( (pNodes[n] == 0 || pNodes[n] == nNodes-1) ? Degree >= 1 : Degree >= 2 )
                return -1; // const 0
            pFront[pNodes[n]] += (1 << 16); // degree++
        }
    }
    // remember equivalence classes
    pEquivs[0] = pFront[pNodes[0]] & 0xFFFF;
    pEquivs[1] = pFront[pNodes[1]] & 0xFFFF;
    // remove some nodes from the frontier
    for ( n = 0; n < 2; n++ )
        if ( Vec_IntEntry(vLife, 2*pNodes[n]+1) == e ) // last time
        {
            int Degree = pFront[pNodes[n]] >> 16;
            if ( (pNodes[n] == 0 || pNodes[n] == nNodes-1) ? Degree != 1 : Degree != 0 && Degree != 2 )
                return -1; // const 0
            // if it is part of the comp, update
            First = -1;
            Vec_IntForEachEntry( vFront2, Node, i )
            {
                assert( Node != pNodes[n] );
                if ( (pFront[Node] & 0xFFFF) == pEquivs[n] )
                {
                    if ( First == -1 )
                        First = Node;
                    pFront[Node] = (pFront[Node] & 0xFFFF0000) | First;
                }
            }
            if ( First != -1 )
                pEquivs[n] = First;
        }
    if ( x )
    {
        // union comp
        int First = -1;
        Vec_IntForEachEntry( vFront2, Node, i )
            if ( (pFront[Node] & 0xFFFF) == pEquivs[0] || (pFront[Node] & 0xFFFF) == pEquivs[1] )
            {
                if ( First == -1 )
                    First = Node;
                pFront[Node] = (pFront[Node] & 0xFFFF0000) | First;
            }
    }
    // create next state
    Vec_IntClear( vStateNew );
    if ( fVerbose ) printf( "Next state: " );
    Vec_IntForEachEntry( vFront2, Node, i )
    {
        Vec_IntPush( vStateNew, pFront[Node] );
        if ( fVerbose ) printf( "%d(%d) ", pFront[Node] & 0xFFFF, pFront[Node] >> 16 );
    }
    if ( fVerbose ) printf( "\n\n" );
    return 1;
}